

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall
Assimp::HMPImporter::ReadFirstSkin
          (HMPImporter *this,uint iNumSkins,uchar *szCursor,uchar **szCursorOut)

{
  uint *puVar1;
  uint uVar2;
  aiMaterial *this_00;
  aiMaterial **ppaVar3;
  DeadlyImportError *this_01;
  uint i;
  uint uVar4;
  uint *puVar5;
  allocator<char> local_69;
  uint *local_68;
  uint local_5c;
  uchar **local_58;
  string local_50;
  
  if (iNumSkins == 0) {
    __assert_fail("0 != iNumSkins",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/HMP/HMPLoader.cpp"
                  ,0x1c6,
                  "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCursor != (uchar *)0x0) {
    uVar4 = *(uint *)szCursor;
    local_58 = szCursorOut;
    if (uVar4 == 0) {
      uVar4 = *(uint *)(szCursor + 0xc);
      if (uVar4 == 0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Unable to read HMP7 skin chunk",&local_69);
        DeadlyImportError::DeadlyImportError(this_01,&local_50);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar5 = (uint *)(szCursor + 0x10);
    }
    else {
      puVar5 = (uint *)(szCursor + 4);
    }
    local_5c = *puVar5;
    uVar2 = puVar5[1];
    local_68 = puVar5 + 2;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    MDLImporter::ParseSkinLump_3DGS_MDL7
              (&this->super_MDLImporter,(uchar *)(puVar5 + 2),(uchar **)&local_68,this_00,uVar4,
               local_5c,uVar2);
    for (uVar4 = 1; uVar4 < iNumSkins; uVar4 = uVar4 + 1) {
      uVar2 = *local_68;
      puVar5 = local_68 + 1;
      puVar1 = local_68 + 2;
      local_68 = local_68 + 3;
      MDLImporter::SkipSkinLump_3DGS_MDL7
                (&this->super_MDLImporter,(uchar *)local_68,(uchar **)&local_68,uVar2,*puVar5,
                 *puVar1);
      MDLImporter::SizeCheck(&this->super_MDLImporter,local_68);
    }
    ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
    ppaVar3 = (aiMaterial **)operator_new__(8);
    ((this->super_MDLImporter).pScene)->mMaterials = ppaVar3;
    *((this->super_MDLImporter).pScene)->mMaterials = this_00;
    *local_58 = (uchar *)local_68;
    return;
  }
  __assert_fail("nullptr != szCursor",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/HMP/HMPLoader.cpp"
                ,0x1c7,
                "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
               );
}

Assistant:

void HMPImporter::ReadFirstSkin(unsigned int iNumSkins, const unsigned char* szCursor,
    const unsigned char** szCursorOut)
{
    ai_assert( 0 != iNumSkins );
    ai_assert( nullptr != szCursor);

    // read the type of the skin ...
    // sometimes we need to skip 12 bytes here, I don't know why ...
    uint32_t iType = *((uint32_t*)szCursor);
    szCursor += sizeof(uint32_t);
    if (0 == iType)
    {
        szCursor += sizeof(uint32_t) * 2;
        iType = *((uint32_t*)szCursor);
        szCursor += sizeof(uint32_t);
        if (!iType)
            throw DeadlyImportError("Unable to read HMP7 skin chunk");

    }
    // read width and height
    uint32_t iWidth  = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);
    uint32_t iHeight = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);

    // allocate an output material
    aiMaterial* pcMat = new aiMaterial();

    // read the skin, this works exactly as for MDL7
    ParseSkinLump_3DGS_MDL7(szCursor,&szCursor,
        pcMat,iType,iWidth,iHeight);

    // now we need to skip any other skins ...
    for (unsigned int i = 1; i< iNumSkins;++i)
    {
        iType   = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iWidth  = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iHeight = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);

        SkipSkinLump_3DGS_MDL7(szCursor,&szCursor,iType,iWidth,iHeight);
        SizeCheck(szCursor);
    }

    // setup the material ...
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    *szCursorOut = szCursor;
}